

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_assertion_tests.cpp
# Opt level: O1

void __thiscall
test::string_assertion_test::iu_StrTest_x_iutest_x_NeString_Test<char>::Body
          (iu_StrTest_x_iutest_x_NeString_Test<char> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  AssertionResult iutest_ar;
  String Test;
  String test;
  type **in_stack_fffffffffffffc38;
  AssertionResult local_3c0;
  AssertionHelper local_398;
  long *local_368;
  long local_360;
  long local_358 [2];
  long *local_348;
  long local_340;
  long local_338 [2];
  long *local_328 [2];
  long local_318 [2];
  long *local_308 [2];
  long local_2f8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  long *local_2c8 [2];
  long local_2b8 [2];
  long *local_2a8 [2];
  long local_298 [2];
  long *local_288 [2];
  long local_278 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  long *local_248 [2];
  long local_238 [2];
  long *local_228 [2];
  long local_218 [2];
  long *local_208 [2];
  long local_1f8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [392];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,text<char>::test,(allocator<char> *)local_1a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_368,(char *)text<char>::Test,(allocator<char> *)local_1a8);
  local_1c8[0] = local_1b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c8,local_348,local_340 + (long)local_348);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,local_368,local_360 + (long)local_368);
  iutest::internal::CmpHelperSTRNE<std::__cxx11::string,std::__cxx11::string>
            (&local_3c0,(internal *)0x3385a0,"Test",(char *)local_1c8,&local_1e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  if (local_3c0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,local_3c0.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc3f);
    local_398.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_398.m_part_result.super_iuCodeMessage.m_line = 0x87;
    local_398.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
    iutest::AssertionHelper::OnFixed(&local_398,(Fixed *)local_1a8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_398.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_398.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_398.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
  }
  paVar1 = &local_3c0.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c0.m_message._M_dataplus._M_p,
                    local_3c0.m_message.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = text<char>::test;
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_208,local_368,local_360 + (long)local_368);
  iutest::internal::CmpHelperSTRNE<char_const*,std::__cxx11::string>
            (&local_3c0,(internal *)"TestFixture::Text::test","Test",pcVar2,(char *)local_208,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc38);
  if (local_208[0] != local_1f8) {
    operator_delete(local_208[0],local_1f8[0] + 1);
  }
  if (local_3c0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,local_3c0.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc3f);
    local_398.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_398.m_part_result.super_iuCodeMessage.m_line = 0x88;
    local_398.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
    iutest::AssertionHelper::OnFixed(&local_398,(Fixed *)local_1a8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_398.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_398.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_398.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c0.m_message._M_dataplus._M_p,
                    local_3c0.m_message.field_2._M_allocated_capacity + 1);
  }
  local_228[0] = local_218;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_228,local_348,local_340 + (long)local_348);
  iutest::internal::CmpHelperSTRNE<std::__cxx11::string,char_const*>
            (&local_3c0,(internal *)0x3385a0,"TestFixture::Text::Test",(char *)local_228,
             text<char>::Test,(char *)&iutest_type_traits::enabler_t<void>::value,
             in_stack_fffffffffffffc38);
  if (local_228[0] != local_218) {
    operator_delete(local_228[0],local_218[0] + 1);
  }
  if (local_3c0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,local_3c0.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc3f);
    local_398.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_398.m_part_result.super_iuCodeMessage.m_line = 0x89;
    local_398.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
    iutest::AssertionHelper::OnFixed(&local_398,(Fixed *)local_1a8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_398.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_398.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_398.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c0.m_message._M_dataplus._M_p,
                    local_3c0.m_message.field_2._M_allocated_capacity + 1);
  }
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_248,local_348,local_340 + (long)local_348);
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_368,local_360 + (long)local_368);
  iutest::internal::CmpHelperSTRNE<std::__cxx11::string,std::__cxx11::string>
            (&local_3c0,(internal *)0x3385a0,"Test",(char *)local_248,&local_268,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if (local_248[0] != local_238) {
    operator_delete(local_248[0],local_238[0] + 1);
  }
  if (local_3c0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,local_3c0.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc3f);
    local_398.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_398.m_part_result.super_iuCodeMessage.m_line = 0x8b;
    local_398.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_398,(Fixed *)local_1a8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_398.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_398.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_398.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c0.m_message._M_dataplus._M_p,
                    local_3c0.m_message.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = text<char>::test;
  local_288[0] = local_278;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_288,local_368,local_360 + (long)local_368);
  iutest::internal::CmpHelperSTRNE<char_const*,std::__cxx11::string>
            (&local_3c0,(internal *)"TestFixture::Text::test","Test",pcVar2,(char *)local_288,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc38);
  if (local_288[0] != local_278) {
    operator_delete(local_288[0],local_278[0] + 1);
  }
  if (local_3c0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,local_3c0.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc3f);
    local_398.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_398.m_part_result.super_iuCodeMessage.m_line = 0x8c;
    local_398.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_398,(Fixed *)local_1a8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_398.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_398.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_398.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c0.m_message._M_dataplus._M_p,
                    local_3c0.m_message.field_2._M_allocated_capacity + 1);
  }
  local_2a8[0] = local_298;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2a8,local_348,local_340 + (long)local_348);
  iutest::internal::CmpHelperSTRNE<std::__cxx11::string,char_const*>
            (&local_3c0,(internal *)0x3385a0,"TestFixture::Text::Test",(char *)local_2a8,
             text<char>::Test,(char *)&iutest_type_traits::enabler_t<void>::value,
             in_stack_fffffffffffffc38);
  if (local_2a8[0] != local_298) {
    operator_delete(local_2a8[0],local_298[0] + 1);
  }
  if (local_3c0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,local_3c0.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc3f);
    local_398.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_398.m_part_result.super_iuCodeMessage.m_line = 0x8d;
    local_398.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_398,(Fixed *)local_1a8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_398.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_398.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_398.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c0.m_message._M_dataplus._M_p,
                    local_3c0.m_message.field_2._M_allocated_capacity + 1);
  }
  local_2c8[0] = local_2b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2c8,local_348,local_340 + (long)local_348);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2e8,local_368,local_360 + (long)local_368);
  iutest::internal::CmpHelperSTRNE<std::__cxx11::string,std::__cxx11::string>
            (&local_3c0,(internal *)0x3385a0,"Test",(char *)local_2c8,&local_2e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if (local_2c8[0] != local_2b8) {
    operator_delete(local_2c8[0],local_2b8[0] + 1);
  }
  if (local_3c0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,local_3c0.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc3f);
    local_398.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_398.m_part_result.super_iuCodeMessage.m_line = 0x8f;
    local_398.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_398,(Fixed *)local_1a8,false);
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_3c0.m_message._M_dataplus._M_p,
                      local_3c0.m_message.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = text<char>::test;
    local_308[0] = local_2f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_308,local_368,local_360 + (long)local_368);
    iutest::internal::CmpHelperSTRNE<char_const*,std::__cxx11::string>
              (&local_3c0,(internal *)"TestFixture::Text::test","Test",pcVar2,(char *)local_308,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc38);
    if (local_308[0] != local_2f8) {
      operator_delete(local_308[0],local_2f8[0] + 1);
    }
    if (local_3c0.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_398,local_3c0.m_message._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffc3f);
      local_398.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
      ;
      local_398.m_part_result.super_iuCodeMessage.m_line = 0x90;
      local_398.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_398,(Fixed *)local_1a8,false);
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_3c0.m_message._M_dataplus._M_p,
                        local_3c0.m_message.field_2._M_allocated_capacity + 1);
      }
      local_328[0] = local_318;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_328,local_348,local_340 + (long)local_348);
      iutest::internal::CmpHelperSTRNE<std::__cxx11::string,char_const*>
                (&local_3c0,(internal *)0x3385a0,"TestFixture::Text::Test",(char *)local_328,
                 text<char>::Test,(char *)&iutest_type_traits::enabler_t<void>::value,
                 in_stack_fffffffffffffc38);
      if (local_328[0] != local_318) {
        operator_delete(local_328[0],local_318[0] + 1);
      }
      if (local_3c0.m_result != false) goto LAB_002ddb49;
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_398,local_3c0.m_message._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffc3f);
      local_398.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
      ;
      local_398.m_part_result.super_iuCodeMessage.m_line = 0x91;
      local_398.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_398,(Fixed *)local_1a8,false);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
      &local_398.m_part_result.super_iuCodeMessage.m_message.field_2) {
    operator_delete(local_398.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_398.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
LAB_002ddb49:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c0.m_message._M_dataplus._M_p,
                    local_3c0.m_message.field_2._M_allocated_capacity + 1);
  }
  if (local_368 != local_358) {
    operator_delete(local_368,local_358[0] + 1);
  }
  if (local_348 != local_338) {
    operator_delete(local_348,local_338[0] + 1);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(StrTest, NeString)
{
    typename TestFixture::String test = TestFixture::Text::test;
    typename TestFixture::String Test = TestFixture::Text::Test;
    IUTEST_INFORM_STRNE(test, Test);
    IUTEST_INFORM_STRNE(TestFixture::Text::test, Test);
    IUTEST_INFORM_STRNE(test, TestFixture::Text::Test);

    IUTEST_EXPECT_STRNE(test, Test);
    IUTEST_EXPECT_STRNE(TestFixture::Text::test, Test);
    IUTEST_EXPECT_STRNE(test, TestFixture::Text::Test);

    IUTEST_ASSERT_STRNE(test, Test);
    IUTEST_ASSERT_STRNE(TestFixture::Text::test, Test);
    IUTEST_ASSERT_STRNE(test, TestFixture::Text::Test);
}